

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_event.c
# Opt level: O1

void te_init(tsd_t *tsd,_Bool is_alloc)

{
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  undefined3 in_register_00000031;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)!is_alloc * 0x10;
  (&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event)
  [(ulong)!is_alloc * 2] =
       *(uint64_t *)
        ((long)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache).bins +
        (uVar5 - 0x28));
  uVar4 = 0xffffffffffffffff;
  if ((CONCAT31(in_register_00000031,is_alloc) != 0) && (duckdb_je_opt_tcache_gc_incr_bytes != 0)) {
    uVar4 = duckdb_je_tcache_gc_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_event_wait = uVar4;
  }
  if ((is_alloc) && (-1 < duckdb_je_opt_stats_interval)) {
    uVar1 = duckdb_je_stats_interval_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_stats_interval_event_wait = uVar1;
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
  }
  if ((!is_alloc) && (duckdb_je_opt_tcache_gc_incr_bytes != 0)) {
    uVar1 = duckdb_je_tcache_gc_dalloc_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_gc_dalloc_event_wait = uVar1;
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
  }
  if (is_alloc) {
    uVar1 = duckdb_je_peak_alloc_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_alloc_event_wait = uVar1;
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
  }
  lVar2 = 0x10;
  if (!is_alloc) {
    uVar1 = duckdb_je_peak_dalloc_new_event_wait(tsd);
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_peak_dalloc_event_wait = uVar1;
    if (uVar1 < uVar4) {
      uVar4 = uVar1;
    }
    lVar2 = 0x20;
  }
  uVar3 = 0x400000;
  if (uVar4 < 0x400000) {
    uVar3 = uVar4;
  }
  *(ulong *)(&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled + lVar2) =
       uVar3 + *(long *)(&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled
                        + (uVar5 | 8));
  duckdb_je_te_recompute_fast_threshold(tsd);
  return;
}

Assistant:

static void
te_init(tsd_t *tsd, bool is_alloc) {
	te_ctx_t ctx;
	te_ctx_get(tsd, &ctx, is_alloc);
	/*
	 * Reset the last event to current, which starts the events from a clean
	 * state.  This is necessary when re-init the tsd event counters.
	 *
	 * The event counters maintain a relationship with the current bytes:
	 * last_event <= current < next_event.  When a reinit happens (e.g.
	 * reincarnated tsd), the last event needs progressing because all
	 * events start fresh from the current bytes.
	 */
	te_ctx_last_event_set(&ctx, te_ctx_current_bytes_get(&ctx));

	uint64_t wait = TE_MAX_START_WAIT;
#define E(event, condition, alloc_event)				\
	if (is_alloc == alloc_event && condition) {			\
		uint64_t event_wait = event##_new_event_wait(tsd);	\
		event_wait = te_clip_event_wait(event_wait);		\
		event##_event_wait_set(tsd, event_wait);		\
		if (event_wait < wait) {				\
			wait = event_wait;				\
		}							\
	}

	ITERATE_OVER_ALL_EVENTS
#undef E
	te_adjust_thresholds_helper(tsd, &ctx, wait);
}